

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Constants.cpp
# Opt level: O2

PSNodesSeq * __thiscall
dg::pta::LLVMPointerGraphBuilder::createConstantExpr(LLVMPointerGraphBuilder *this,ConstantExpr *CE)

{
  PSNode *node;
  PSNodesSeq *pPVar1;
  Pointer ptr;
  Pointer local_20;
  
  local_20 = getConstantExprPointer(this,CE);
  node = PointerGraph::create<(dg::pta::PSNodeType)18,dg::pta::PSNode*&,dg::Offset&>
                   ((PointerGraph *)this,&local_20.target,&local_20.offset);
  pPVar1 = addNode(this,(Value *)CE,node);
  return pPVar1;
}

Assistant:

LLVMPointerGraphBuilder::PSNodesSeq &
LLVMPointerGraphBuilder::createConstantExpr(const llvm::ConstantExpr *CE) {
    Pointer ptr = getConstantExprPointer(CE);
    PSNode *node = PS.create<PSNodeType::CONSTANT>(ptr.target, ptr.offset);

    return addNode(CE, node);
}